

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O0

void ArrayDelete<aiLight>(aiLight ***in,uint *num)

{
  uint local_1c;
  uint i;
  uint *num_local;
  aiLight ***in_local;
  
  for (local_1c = 0; local_1c < *num; local_1c = local_1c + 1) {
    if ((*in)[local_1c] != (aiLight *)0x0) {
      operator_delete((*in)[local_1c],0x46c);
    }
  }
  if (*in != (aiLight **)0x0) {
    operator_delete__(*in);
  }
  *in = (aiLight **)0x0;
  *num = 0;
  return;
}

Assistant:

inline void ArrayDelete(T**& in, unsigned int& num)
{
    for (unsigned int i = 0; i < num; ++i)
        delete in[i];

    delete[] in;
    in = NULL;
    num = 0;
}